

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O2

CCharmapToLocal * CCharmapToLocal::load(CResLoader *res_loader,char *table_name)

{
  _func_int **pp_Var1;
  int iVar2;
  CCharmapToLocal *pCVar3;
  undefined **ppuVar4;
  FILE *__stream;
  charmap_type_t map_type;
  charmap_type_t local_1c;
  
  iVar2 = CCharmap::name_is_utf8_synonym(table_name);
  if (iVar2 == 0) {
    iVar2 = CCharmap::name_is_ucs2le_synonym(table_name);
    if (iVar2 == 0) {
      iVar2 = CCharmap::name_is_ucs2be_synonym(table_name);
      if (iVar2 == 0) {
        __stream = (FILE *)CCharmap::open_map_file_syn(res_loader,table_name,&local_1c);
        if (__stream != (FILE *)0x0) {
          if ((ulong)local_1c < 3) {
            pp_Var1 = (_func_int **)(&PTR_PTR_00304148)[local_1c];
            pCVar3 = (CCharmapToLocal *)operator_new(0x1028);
            memset(pCVar3,0,0x1020);
            (pCVar3->super_CCharmap).ref_cnt_ = 1;
            pCVar3->exp_array_ = (wchar_t *)0x0;
            memset(pCVar3->map_,0,0x1008);
            (pCVar3->super_CCharmap)._vptr_CCharmap = pp_Var1;
            load_table(pCVar3,(osfildef *)__stream);
          }
          else {
            pCVar3 = (CCharmapToLocal *)0x0;
          }
          fclose(__stream);
          return pCVar3;
        }
        iVar2 = CCharmap::name_is_ascii_synonym(table_name);
        if (iVar2 != 0) {
          pCVar3 = (CCharmapToLocal *)operator_new(0x1028);
          CCharmapToLocalASCII::CCharmapToLocalASCII((CCharmapToLocalASCII *)pCVar3);
          return pCVar3;
        }
        iVar2 = CCharmap::name_is_8859_1_synonym(table_name);
        if (iVar2 != 0) {
          pCVar3 = (CCharmapToLocal *)operator_new(0x1028);
          CCharmapToLocal8859_1::CCharmapToLocal8859_1((CCharmapToLocal8859_1 *)pCVar3);
          return pCVar3;
        }
        return (CCharmapToLocal *)0x0;
      }
      pCVar3 = (CCharmapToLocal *)operator_new(0x1028);
      memset(pCVar3,0,0x1020);
      (pCVar3->super_CCharmap).ref_cnt_ = 1;
      pCVar3->exp_array_ = (wchar_t *)0x0;
      memset(pCVar3->map_,0,0x1008);
      ppuVar4 = &PTR__CCharmapToLocal_00303e78;
    }
    else {
      pCVar3 = (CCharmapToLocal *)operator_new(0x1028);
      memset(pCVar3,0,0x1020);
      (pCVar3->super_CCharmap).ref_cnt_ = 1;
      pCVar3->exp_array_ = (wchar_t *)0x0;
      memset(pCVar3->map_,0,0x1008);
      ppuVar4 = &PTR__CCharmapToLocal_00303e18;
    }
  }
  else {
    pCVar3 = (CCharmapToLocal *)operator_new(0x1028);
    memset(pCVar3,0,0x1020);
    (pCVar3->super_CCharmap).ref_cnt_ = 1;
    pCVar3->exp_array_ = (wchar_t *)0x0;
    memset(pCVar3->map_,0,0x1008);
    ppuVar4 = &PTR__CCharmapToLocal_00303db8;
  }
  (pCVar3->super_CCharmap)._vptr_CCharmap = (_func_int **)ppuVar4;
  return pCVar3;
}

Assistant:

CCharmapToLocal *CCharmapToLocal::load(CResLoader *res_loader,
                                       const char *table_name)
{
    osfildef *fp;
    CCharmapToLocal *mapper;
    charmap_type_t map_type;

    /* if they want a trivial UTF-8 translator, return one */
    if (name_is_utf8_synonym(table_name))
        return new CCharmapToLocalUTF8();

    /* if they want a Unicode 16-bit encoding, return one */
    if (name_is_ucs2le_synonym(table_name))
        return new CCharmapToLocalUcs2Little();

    if (name_is_ucs2be_synonym(table_name))
        return new CCharmapToLocalUcs2Big();

    /* presume failure */
    mapper = 0;

    /* open and characterize the mapping file */
    fp = open_map_file_syn(res_loader, table_name, &map_type);

    /* if we didn't find a map file, check for built-in mappings */
    if (fp == 0)
    {
        /* if they want a plain ASCII translator, return a default one */
        if (name_is_ascii_synonym(table_name))
            return new CCharmapToLocalASCII();

        /* if they want a plain ISO-8859-1 translator, return a default one */
        if (name_is_8859_1_synonym(table_name))
            return new CCharmapToLocal8859_1();

        /* no map file - return failure */
        return 0;
    }

    /* create an appropriate mapper */
    switch(map_type)
    {
    case CHARMAP_TYPE_SB:
        /* create a single-byte mapper */
        mapper = new CCharmapToLocalSB();
        break;

    case CHARMAP_TYPE_DB:
        /* create a double-byte mapper */
        mapper = new CCharmapToLocalDB();
        break;

    case CHARMAP_TYPE_MB:
        /* create a mixed multi-byte mapper */
        mapper = new CCharmapToLocalMB();
        break;

    default:
        /* other mapper types are currently unknown */
        break;
    }

    /* if we successfully created a mapper, tell it to load the table */
    if (mapper != 0)
    {
        /* load the table */
        mapper->load_table(fp);
    }

    /* close the file */
    osfcls(fp);

    /* return the mapper, if any */
    return mapper;
}